

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deque.hpp
# Opt level: O2

void __thiscall Lib::Deque<Kernel::Clause_*>::push_back(Deque<Kernel::Clause_*> *this,Clause *elem)

{
  Clause **ppCVar1;
  bool bVar2;
  
  bVar2 = shouldExpand(this);
  if (bVar2) {
    expand(this);
  }
  *this->_back = elem;
  ppCVar1 = this->_back;
  this->_back = ppCVar1 + 1;
  if (ppCVar1 + 1 == this->_end) {
    this->_back = this->_data;
  }
  return;
}

Assistant:

inline
  void push_back(C elem)
  {
    if(shouldExpand()) {
      expand();
    }
    ASS(_back < _end);
    ::new (_back) C(elem);

    _back++;
    if(_back==_end) {
      _back=_data;
    }
    ASS_NEQ(_front, _back);
  }